

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O1

void fiobj_free(FIOBJ o)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  byte *pbVar5;
  
  if ((((o & 1) == 0) && (o != 0)) && (uVar4 = (uint)o & 6, uVar4 != 6)) {
    pbVar5 = (byte *)(o & 0xfffffffffffffff8);
    LOCK();
    pbVar1 = pbVar5 + 4;
    *(int *)pbVar1 = *(int *)pbVar1 + -1;
    UNLOCK();
    if (*(int *)pbVar1 == 0) {
      bVar3 = (byte)o;
      if (o == 0 || (o & 1) != 0) {
        bVar2 = (o == 0) * '\x05' + 1;
      }
      else {
        switch(uVar4) {
        case 0:
          bVar2 = *pbVar5;
          break;
        case 2:
          bVar2 = 0x28;
          break;
        case 4:
          bVar2 = 0x2a;
          break;
        case 6:
          bVar2 = bVar3;
        }
      }
      if (bVar2 - 0x27 < 5) {
        (*(code *)(&DAT_001710e0 + *(int *)(&DAT_001710e0 + (ulong)(bVar2 - 0x27) * 4)))();
        return;
      }
      if ((o & 1) == 0 && o != 0) {
        switch(uVar4) {
        case 0:
          bVar3 = *pbVar5;
          break;
        case 2:
          bVar3 = 0x28;
          break;
        case 4:
          bVar3 = 0x2a;
          break;
        case 6:
        }
      }
      else {
        bVar3 = (o == 0) * '\x05' + 1;
      }
      if (4 < bVar3 - 0x27) {
        fiobject___simple_dealloc(o,(_func_void_FIOBJ_void_ptr *)0x0,(void *)0x0);
        return;
      }
      (*(code *)(&DAT_00171140 + *(int *)(&DAT_00171140 + (ulong)(bVar3 - 0x27) * 4)))();
      return;
    }
  }
  return;
}

Assistant:

FIO_INLINE void fiobj_free(FIOBJ o) {
  if (!FIOBJ_IS_ALLOCATED(o))
    return;
  if (fiobj_ref_dec(o))
    return;
  if (FIOBJECT2VTBL(o)->each && FIOBJECT2VTBL(o)->count(o))
    fiobj_free_complex_object(o);
  else
    FIOBJECT2VTBL(o)->dealloc(o, NULL, NULL);
}